

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# observer.hpp
# Opt level: O2

void __thiscall
baryonyx::details::ap_pnm_observer::make_observation<float>
          (ap_pnm_observer *this,sparse_matrix<int> *ap,float *P,float *param_3)

{
  uint uVar1;
  rgb rVar2;
  pointer_type puVar3;
  anon_union_8_2_de49483c_for_basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>_2
  in_R9;
  int k;
  size_type row;
  string_view format_str;
  basic_string_view<char> bVar4;
  format_args args;
  pnm_array pnm;
  undefined1 local_88 [16];
  __uniq_ptr_impl<int,_std::default_delete<int[]>_> local_78;
  sparse_matrix<int> *local_60;
  colormap local_58;
  string local_50;
  
  local_58.m_lower = -1.0;
  local_58.m_upper = 1.0;
  local_60 = ap;
  pnm_array::pnm_array(&pnm,this->constraints,this->variables);
  if ((__uniq_ptr_impl<unsigned_char,_std::default_delete<unsigned_char[]>_>)
      pnm.m_buffer._M_t.super___uniq_ptr_impl<unsigned_char,_std::default_delete<unsigned_char[]>_>.
      _M_t.super__Tuple_impl<0UL,_unsigned_char_*,_std::default_delete<unsigned_char[]>_>.
      super__Head_base<0UL,_unsigned_char_*,_false>._M_head_impl !=
      (__uniq_ptr_impl<unsigned_char,_std::default_delete<unsigned_char[]>_>)0x0) {
    uVar1 = pnm.m_heigth * pnm.m_width * 3;
    if (uVar1 != 0) {
      memset((void *)pnm.m_buffer._M_t.
                     super___uniq_ptr_impl<unsigned_char,_std::default_delete<unsigned_char[]>_>.
                     _M_t.
                     super__Tuple_impl<0UL,_unsigned_char_*,_std::default_delete<unsigned_char[]>_>.
                     super__Head_base<0UL,_unsigned_char_*,_false>._M_head_impl,0,(ulong)uVar1);
    }
    for (row = 0; row != (uint)this->constraints; row = row + 1) {
      sparse_matrix<int>::row((sparse_matrix<int> *)local_88,(int)local_60);
      for (; local_88._8_8_ != local_88._0_8_; local_88._8_8_ = local_88._8_8_ + 8) {
        puVar3 = pnm_array::operator()(&pnm,row,(long)*(int *)(local_88._8_8_ + 4));
        rVar2 = colormap::operator()(&local_58,P[*(int *)local_88._8_8_]);
        *puVar3 = rVar2.red;
        puVar3[1] = rVar2.green;
        puVar3[2] = rVar2.blue;
      }
    }
    local_78._M_t.super__Tuple_impl<0UL,_int_*,_std::default_delete<int[]>_>.
    super__Head_base<0UL,_int_*,_false>._M_head_impl._4_4_ = 0;
    local_78._M_t.super__Tuple_impl<0UL,_int_*,_std::default_delete<int[]>_>.
    super__Head_base<0UL,_int_*,_false>._M_head_impl._0_4_ = this->m_frame;
    this->m_frame = this->m_frame + 1;
    local_88._0_8_ = (this->m_basename)._M_dataplus._M_p;
    local_88._8_8_ = (this->m_basename)._M_string_length;
    bVar4 = ::fmt::v7::to_string_view<char,_0>("{}-P-{}.pnm");
    format_str.data_ = (char *)bVar4.size_;
    format_str.size_ = 0x1d;
    args.
    super_basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
    .field_1.args_ = in_R9.args_;
    args.
    super_basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
    .desc_ = (unsigned_long_long)local_88;
    ::fmt::v7::detail::vformat_abi_cxx11_(&local_50,(detail *)bVar4.data_,format_str,args);
    pnm_array::operator()(&pnm,&local_50);
    std::__cxx11::string::~string((string *)&local_50);
  }
  std::unique_ptr<unsigned_char[],_std::default_delete<unsigned_char[]>_>::~unique_ptr
            (&pnm.m_buffer);
  return;
}

Assistant:

void make_observation(const sparse_matrix<int>& ap,
                          const Float* P,
                          const Float* /*pi*/)
    {
        static_assert(std::is_floating_point<Float>::value);

        colormap cm(-1.0f, 1.0f);
        pnm_array pnm(constraints, variables);
        if (!pnm)
            return;

        pnm.clear();
        for (int k = 0; k != constraints; ++k) {
            auto [it, et] = ap.row(k);

            for (; it != et; ++it) {
                std::uint8_t* pointer = pnm(k, it->column);
                auto color_rgb = cm(P[it->value]);

                pointer[0] = color_rgb.red;
                pointer[1] = color_rgb.green;
                pointer[2] = color_rgb.blue;
            }
        }

        pnm(fmt::format("{}-P-{}.pnm", m_basename, m_frame++));
    }